

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

int __thiscall jpgd::jpeg_decoder::init_scan(jpeg_decoder *this)

{
  int iVar1;
  
  iVar1 = locate_sos_marker(this);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    calc_mcu_block_order(this);
    check_huff_tables(this);
    check_quant_tables(this);
    memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
    this->m_eob_run = 0;
    if (this->m_restart_interval != 0) {
      this->m_restarts_left = this->m_restart_interval;
      this->m_next_restart_num = 0;
    }
    fix_in_buffer(this);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int jpeg_decoder::init_scan()
{
  if (!locate_sos_marker())
    return JPGD_FALSE;

  calc_mcu_block_order();

  check_huff_tables();

  check_quant_tables();

  memset(m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

  m_eob_run = 0;

  if (m_restart_interval)
  {
    m_restarts_left = m_restart_interval;
    m_next_restart_num = 0;
  }

  fix_in_buffer();

  return JPGD_TRUE;
}